

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

void translate_help(char *name)

{
  printf("usage: \n %s translate input_mesh.extension output_mesh.extension \n",name);
  putchar(10);
  puts("  options:");
  puts("   --scale <scale> scales vertex locations about origin.");
  puts("   --shift <dx> <dy> <dz> shift vertex locations.");
  puts("   --rotatey <deg> rotate vertex locations about (0,0,0).");
  puts("   --surface extracts surface elements (deletes volume).");
  puts("   --enrich2 promotes elements to Q2.");
  puts("   --shard converts mixed-elments to simplicies.");
  puts("   --extrude a 2D mesh to single layer of prisms.");
  puts("       extrusion added implicitly for ugrid output files");
  puts("   --planes <N> extrude a 2D mesh to N layers of prisms.");
  puts("   --zero-y-face <face id> explicitly set y=0 on face id.");
  puts("   --axi convert an extruded mesh into a wedge at z=y=0 axis");
  putchar(10);
  return;
}

Assistant:

static void translate_help(const char *name) {
  printf("usage: \n %s translate input_mesh.extension output_mesh.extension \n",
         name);
  printf("\n");
  printf("  options:\n");
  printf("   --scale <scale> scales vertex locations about origin.\n");
  printf("   --shift <dx> <dy> <dz> shift vertex locations.\n");
  printf("   --rotatey <deg> rotate vertex locations about (0,0,0).\n");
  printf("   --surface extracts surface elements (deletes volume).\n");
  printf("   --enrich2 promotes elements to Q2.\n");
  printf("   --shard converts mixed-elments to simplicies.\n");
  printf("   --extrude a 2D mesh to single layer of prisms.\n");
  printf("       extrusion added implicitly for ugrid output files\n");
  printf("   --planes <N> extrude a 2D mesh to N layers of prisms.\n");
  printf("   --zero-y-face <face id> explicitly set y=0 on face id.\n");
  printf("   --axi convert an extruded mesh into a wedge at z=y=0 axis\n");
  printf("\n");
}